

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest13::verifyReadBuffer
          (FunctionalTest13 *this,uint n_fs_id,uint n_fs_subroutine,uint n_gs_id,
          uint n_gs_subroutine,uint n_tc_id,uint n_tc_subroutine,uint n_te_id,uint n_te_subroutine,
          uint n_vs_id,uint n_vs_subroutine)

{
  float *value;
  ostringstream *this_00;
  bool bVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  MessageBuilder *pMVar6;
  uint uVar7;
  uint uVar8;
  FunctionalTest13 *pFVar9;
  uint n_component;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fs_modifier [4];
  float vs_modifier [4];
  float te_modifier [4];
  float tc_modifier [4];
  float local_288 [4];
  FunctionalTest13 *local_278;
  ulong local_270;
  float local_268 [6];
  ulong local_250;
  ulong local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  ulong local_210;
  ulong local_208;
  uchar *local_200;
  float local_1f8 [18];
  undefined1 local_1b0 [384];
  
  local_288[0] = 0.0;
  local_288[1] = 0.0;
  local_288[2] = 0.0;
  local_288[3] = 0.0;
  local_268[0] = 0.0;
  local_268[1] = 0.0;
  local_268[2] = 0.0;
  local_268[3] = 0.0;
  local_1f8[0xc] = 0.0;
  local_1f8[0xd] = 0.0;
  local_1f8[0xe] = 0.0;
  local_1f8[0xf] = 0.0;
  local_1f8[8] = 0.0;
  local_1f8[9] = 0.0;
  local_1f8[10] = 0.0;
  local_1f8[0xb] = 0.0;
  local_1f8[4] = 0.0;
  local_1f8[5] = 0.0;
  local_1f8[6] = 0.0;
  local_1f8[7] = 0.0;
  local_1f8[0] = 0.0;
  local_1f8[1] = 0.0;
  local_1f8[2] = 0.0;
  local_1f8[3] = 0.0;
  lVar10 = 0;
  if (n_fs_subroutine == 0) {
    while( true ) {
      if (lVar10 == 4) break;
      local_268[lVar10] = (float)(n_fs_id + 1 + (int)lVar10) / 10.0;
      lVar10 = lVar10 + 1;
    }
  }
  else {
    while( true ) {
      if (lVar10 == 4) break;
      local_268[lVar10] = (float)(n_fs_id + 1 + (int)lVar10) / 20.0;
      lVar10 = lVar10 + 1;
    }
  }
  local_1f8[0xf] =
       (float)(n_gs_id + 1) * *(float *)(&DAT_016b0000 + (ulong)(n_gs_subroutine == 0) * 4);
  local_1f8[9] = (float)(n_tc_id + 1) *
                 *(float *)(&DAT_016b0008 + (ulong)(n_tc_subroutine == 0) * 4);
  local_1f8[6] = (float)(n_te_id + 1) *
                 *(float *)(&DAT_016b0010 + (ulong)(n_te_subroutine == 0) * 4);
  local_1f8[0] = (float)(n_vs_id + 1) *
                 *(float *)(&DAT_016b0018 + (ulong)(n_vs_subroutine == 0) * 4);
  local_278 = this;
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 4) {
    *(float *)((long)local_288 + lVar10) =
         *(float *)((long)local_268 + lVar10) + *(float *)((long)local_1f8 + lVar10 + 0x30) +
         *(float *)((long)local_1f8 + lVar10 + 0x20) + *(float *)((long)local_1f8 + lVar10 + 0x10) +
         *(float *)((long)local_1f8 + lVar10);
  }
  fVar2 = local_288[0];
  fVar3 = local_288[1];
  fVar4 = local_288[2];
  fVar5 = local_288[3];
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_208 = (ulong)n_fs_id;
  local_210 = (ulong)n_fs_subroutine;
  local_218 = (ulong)n_gs_id;
  local_220 = (ulong)n_gs_subroutine;
  local_228 = (ulong)n_tc_id;
  local_230 = (ulong)n_tc_subroutine;
  local_238 = (ulong)n_te_id;
  local_240 = (ulong)n_te_subroutine;
  local_248 = (ulong)n_vs_id;
  local_250 = (ulong)n_vs_subroutine;
  bVar1 = true;
  local_270 = 0;
  pFVar9 = local_278;
  do {
    if ((pFVar9->m_to_height <= local_270) || (!bVar1)) {
      return;
    }
    uVar7 = pFVar9->m_to_width;
    local_200 = pFVar9->m_read_buffer + (ulong)((int)local_270 * uVar7 * 4) * 4;
    uVar8 = 0;
    uVar11 = 0;
    while ((uVar11 < uVar7 && (bVar1))) {
      value = (float *)(local_200 + (ulong)uVar8 * 4);
      fVar12 = *value - fVar2;
      fVar13 = -fVar12;
      if (-fVar12 <= fVar12) {
        fVar13 = fVar12;
      }
      if (1e-05 < fVar13) {
LAB_00a21f41:
        local_1b0._0_8_ = ((pFVar9->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,"Invalid texel rendered at (");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00,") for the following configuration: n_fs_id:");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," n_fs_subroutine:");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," n_gs_id:");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," n_gs_subroutine:");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," n_tc_id:");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," n_tc_subroutine:");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," n_te_id:");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," n_te_subroutine:");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," n_vs_id:");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00," n_vs_subroutine:");
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::operator<<((ostream *)this_00,"; expected:(");
        std::ostream::operator<<(this_00,fVar2);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,fVar3);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,fVar4);
        std::operator<<((ostream *)this_00,", ");
        std::ostream::operator<<(this_00,fVar5);
        std::operator<<((ostream *)this_00,"), found:(");
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,value);
        std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value + 1);
        std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value + 2);
        std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,value + 3);
        std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,").");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        local_278->m_has_test_passed = false;
        uVar7 = local_278->m_to_width;
        bVar1 = false;
        pFVar9 = local_278;
      }
      else {
        fVar12 = value[1] - fVar3;
        fVar13 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar13 = fVar12;
        }
        if (1e-05 < fVar13) goto LAB_00a21f41;
        fVar12 = value[2] - fVar4;
        fVar13 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar13 = fVar12;
        }
        if (1e-05 < fVar13) goto LAB_00a21f41;
        fVar12 = value[3] - fVar5;
        fVar13 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar13 = fVar12;
        }
        if (1e-05 < fVar13) goto LAB_00a21f41;
      }
      uVar11 = uVar11 + 1;
      uVar8 = uVar8 + 4;
    }
    local_270 = local_270 + 1;
  } while( true );
}

Assistant:

void FunctionalTest13::verifyReadBuffer(unsigned int n_fs_id, unsigned int n_fs_subroutine, unsigned int n_gs_id,
										unsigned int n_gs_subroutine, unsigned int n_tc_id,
										unsigned int n_tc_subroutine, unsigned int n_te_id,
										unsigned int n_te_subroutine, unsigned int n_vs_id,
										unsigned int n_vs_subroutine)
{
	float expected_color[4] = { 0 };
	float fs_modifier[4]	= { 0 };
	float gs_modifier[4]	= { 0 };
	float tc_modifier[4]	= { 0 };
	float te_modifier[4]	= { 0 };
	float vs_modifier[4]	= { 0 };

	if (n_fs_subroutine == 0)
	{
		for (unsigned int n_component = 0; n_component < 4; ++n_component)
		{
			fs_modifier[n_component] = float(n_fs_id + n_component + 1) / 10.0f;
		}
	}
	else
	{
		for (unsigned int n_component = 0; n_component < 4; ++n_component)
		{
			fs_modifier[n_component] = float(n_fs_id + n_component + 1) / 20.0f;
		}
	}

	if (n_gs_subroutine == 0)
	{
		gs_modifier[3] = float(n_gs_id + 1) * 0.425f;
	}
	else
	{
		gs_modifier[3] = float(n_gs_id + 1) * 0.0425f;
	}

	if (n_tc_subroutine == 0)
	{
		tc_modifier[1] = float(n_tc_id + 1) * 0.25f;
	}
	else
	{
		tc_modifier[1] = float(n_tc_id + 1) * 0.025f;
	}

	if (n_te_subroutine == 0)
	{
		te_modifier[2] = float(n_te_id + 1) * 0.325f;
	}
	else
	{
		te_modifier[2] = float(n_te_id + 1) * 0.0325f;
	}

	if (n_vs_subroutine == 0)
	{
		vs_modifier[0] = float(n_vs_id + 1) * 0.125f;
	}
	else
	{
		vs_modifier[0] = float(n_vs_id + 1) * 0.0125f;
	}

	/* Determine the expected color */
	for (unsigned int n_component = 0; n_component < 4 /* rgba */; ++n_component)
	{
		expected_color[n_component] = fs_modifier[n_component] + gs_modifier[n_component] + tc_modifier[n_component] +
									  te_modifier[n_component] + vs_modifier[n_component];
	}

	/* Verify all read texels are valid */
	const float epsilon			= 1e-5f;
	bool		should_continue = true;

	for (unsigned int y = 0; y < m_to_height && should_continue; ++y)
	{
		const float* row_ptr = (const float*)m_read_buffer + y * m_to_width * 4; /* rgba */

		for (unsigned int x = 0; x < m_to_width && should_continue; ++x)
		{
			const float* texel_ptr = row_ptr + x * 4; /* rgba */

			if (de::abs(texel_ptr[0] - expected_color[0]) > epsilon ||
				de::abs(texel_ptr[1] - expected_color[1]) > epsilon ||
				de::abs(texel_ptr[2] - expected_color[2]) > epsilon ||
				de::abs(texel_ptr[3] - expected_color[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid texel rendered at (" << x << ", " << y
								   << ") for "
									  "the following configuration: "
									  "n_fs_id:"
								   << n_fs_id << " n_fs_subroutine:" << n_fs_subroutine << " n_gs_id:" << n_gs_id
								   << " n_gs_subroutine:" << n_gs_subroutine << " n_tc_id:" << n_tc_id
								   << " n_tc_subroutine:" << n_tc_subroutine << " n_te_id:" << n_te_id
								   << " n_te_subroutine:" << n_te_subroutine << " n_vs_id:" << n_vs_id
								   << " n_vs_subroutine:" << n_vs_subroutine << "; expected:"
																				"("
								   << expected_color[0] << ", " << expected_color[1] << ", " << expected_color[2]
								   << ", " << expected_color[3] << "), found:"
																   "("
								   << texel_ptr[0] << ", " << texel_ptr[1] << ", " << texel_ptr[2] << ", "
								   << texel_ptr[3] << ")." << tcu::TestLog::EndMessage;

				m_has_test_passed = false;
				should_continue   = false;
			}
		} /* for (all columns) */
	}	 /* for (all rows) */
}